

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedLinearAllocator.hpp
# Opt level: O0

Char * __thiscall
Diligent::FixedLinearAllocator::CopyString(FixedLinearAllocator *this,char *Str,size_t StrLen)

{
  Char *Ptr;
  size_t StrLen_local;
  char *Str_local;
  FixedLinearAllocator *this_local;
  
  if (Str == (char *)0x0) {
    this_local = (FixedLinearAllocator *)0x0;
  }
  else {
    Ptr = (Char *)StrLen;
    if (StrLen == 0) {
      Ptr = (Char *)strlen(Str);
    }
    this_local = (FixedLinearAllocator *)Allocate(this,(size_t)(Ptr + 1),1);
    memcpy(this_local,Str,(size_t)Ptr);
    Ptr[(long)&this_local->m_pDataStart] = '\0';
  }
  return (Char *)this_local;
}

Assistant:

NODISCARD const Char* CopyString(const char* Str, size_t StrLen = 0)
    {
        if (Str == nullptr)
            return nullptr;

        if (StrLen == 0)
            StrLen = strlen(Str);

        auto* Ptr = reinterpret_cast<Char*>(Allocate(StrLen + 1, 1));
        std::memcpy(Ptr, Str, StrLen);
        Ptr[StrLen] = '\0';

        return Ptr;
    }